

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.capnp.h
# Opt level: O0

Builder * __thiscall
capnp::schema::Field::Builder::initSlot(Builder *__return_storage_ptr__,Builder *this)

{
  StructBuilder base;
  uint uVar1;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  PointerBuilder local_40;
  PointerBuilder local_28;
  Builder *local_10;
  Builder *this_local;
  
  local_10 = this;
  uVar1 = bounded<4u>();
  capnp::_::StructBuilder::setDataField<capnp::schema::Field::Which>(&this->_builder,uVar1,SLOT);
  uVar1 = bounded<1u>();
  capnp::_::StructBuilder::setDataField<unsigned_int>(&this->_builder,uVar1,0);
  uVar1 = bounded<128u>();
  capnp::_::StructBuilder::setDataField<bool>(&this->_builder,uVar1,false);
  uVar1 = bounded<2u>();
  capnp::_::StructBuilder::getPointerField(&local_28,&this->_builder,uVar1);
  capnp::_::PointerBuilder::clear(&local_28);
  uVar1 = bounded<3u>();
  capnp::_::StructBuilder::getPointerField(&local_40,&this->_builder,uVar1);
  capnp::_::PointerBuilder::clear(&local_40);
  memcpy(&local_68,this,0x28);
  base.capTable = (CapTableBuilder *)uStack_60;
  base.segment = (SegmentBuilder *)local_68;
  base.data = (void *)local_58;
  base.pointers = (WirePointer *)uStack_50;
  base.dataSize = (undefined4)local_48;
  base.pointerCount = local_48._4_2_;
  base._38_2_ = local_48._6_2_;
  Slot::Builder::Builder(__return_storage_ptr__,base);
  return __return_storage_ptr__;
}

Assistant:

inline typename Field::Slot::Builder Field::Builder::initSlot() {
  _builder.setDataField<Field::Which>(
      ::capnp::bounded<4>() * ::capnp::ELEMENTS, Field::SLOT);
  _builder.setDataField< ::uint32_t>(::capnp::bounded<1>() * ::capnp::ELEMENTS, 0);
  _builder.setDataField<bool>(::capnp::bounded<128>() * ::capnp::ELEMENTS, 0);
  _builder.getPointerField(::capnp::bounded<2>() * ::capnp::POINTERS).clear();
  _builder.getPointerField(::capnp::bounded<3>() * ::capnp::POINTERS).clear();
  return typename Field::Slot::Builder(_builder);
}